

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void expandFormatArguments<String,int,String,String>
               (vector<String,_std::allocator<String>_> *data,String *arg,int *rest,String *rest_1,
               String *rest_2)

{
  String *__x;
  FormatArgument local_50;
  String *local_30;
  String *rest_local_2;
  String *rest_local_1;
  int *rest_local;
  String *arg_local;
  vector<String,_std::allocator<String>_> *data_local;
  
  local_30 = rest_2;
  rest_local_2 = rest_1;
  rest_local_1 = (String *)rest;
  rest_local = (int *)arg;
  arg_local = (String *)data;
  FormatArgument::FormatArgument<String>(&local_50,arg);
  __x = FormatArgument::text(&local_50);
  std::vector<String,_std::allocator<String>_>::push_back(data,__x);
  FormatArgument::~FormatArgument(&local_50);
  expandFormatArguments<int,String,String>
            ((vector<String,_std::allocator<String>_> *)arg_local,(int *)rest_local_1,rest_local_2,
             local_30);
  return;
}

Assistant:

void expandFormatArguments (std::vector<String>& data, const T& arg, const RestTypes& ... rest)
{
	data.push_back (FormatArgument (arg).text());
	expandFormatArguments (data, rest...);
}